

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O3

int SUNLinSolSetPreconditioner(SUNLinearSolver S,void *P_data,SUNPSetupFn Pset,SUNPSolveFn Psol)

{
  _func_int_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *UNRECOVERED_JUMPTABLE;
  int iVar1;
  
  UNRECOVERED_JUMPTABLE = S->ops->setpreconditioner;
  if (UNRECOVERED_JUMPTABLE != (_func_int_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(S,P_data,Pset,Psol);
    return iVar1;
  }
  return 0;
}

Assistant:

int SUNLinSolSetPreconditioner(SUNLinearSolver S, void* P_data,
                               SUNPSetupFn Pset, SUNPSolveFn Psol)
{
  int ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(S));
  if (S->ops->setpreconditioner)
    ier = S->ops->setpreconditioner(S, P_data, Pset, Psol);
  else
    ier = SUNLS_SUCCESS;
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(S));
  return(ier);
}